

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

void __thiscall
ON_Xform::Rotation(ON_Xform *this,double sin_angle,double cos_angle,ON_3dVector axis,
                  ON_3dPoint center)

{
  bool bVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ON_3dVector local_58;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  pdVar3 = (double *)&IdentityTransformation;
  pdVar4 = (double *)this;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar4 = pdVar4 + 1;
  }
  if ((ABS(sin_angle) < 0.9999999850988388) || (1.490116119385e-08 < ABS(cos_angle))) {
    if ((1.490116119385e-08 < ABS(sin_angle)) || (ABS(cos_angle) < 0.9999999850988388)) {
      if (1.490116119385e-08 < ABS(cos_angle * cos_angle + sin_angle * sin_angle + -1.0)) {
        ON_2dVector::ON_2dVector((ON_2dVector *)&local_58,cos_angle,sin_angle);
        bVar1 = ON_2dVector::Unitize((ON_2dVector *)&local_58);
        if (!bVar1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xform.cpp"
                     ,0x838,"","sin_angle and cos_angle are both zero.");
          local_58.y = 0.0;
          local_58.x = 1.0;
        }
        in_XMM0_Qb = 0;
        in_XMM1_Qb = 0;
        cos_angle = local_58.x;
        sin_angle = local_58.y;
        if (!bVar1) goto LAB_0068b1c1;
      }
      if ((ABS(cos_angle) <= 0.9999999999999998) && (2.220446049250313e-16 <= ABS(sin_angle))) {
        if ((2.220446049250313e-16 <= ABS(cos_angle)) && (ABS(sin_angle) <= 0.9999999999999998))
        goto LAB_0068b1c1;
        goto LAB_0068b0ac;
      }
    }
    sin_angle = 0.0;
    in_XMM0_Qb = 0;
    cos_angle = *(double *)(&DAT_006a8450 + (ulong)(cos_angle < 0.0) * 8);
    in_XMM1_Qb = 0;
  }
  else {
LAB_0068b0ac:
    in_XMM1_Qb = 0;
    in_XMM0_Qb = 0;
    cos_angle = 0.0;
    sin_angle = *(double *)(&DAT_006a8450 + (ulong)(sin_angle < 0.0) * 8);
  }
LAB_0068b1c1:
  if ((((sin_angle != 0.0) || (NAN(sin_angle))) || (cos_angle != 1.0)) || (NAN(cos_angle))) {
    local_40 = 1.0 - cos_angle;
    local_58.z = axis.z;
    local_58.x = axis.x;
    local_58.y = axis.y;
    local_38 = cos_angle;
    uStack_30 = in_XMM1_Qb;
    local_28 = sin_angle;
    uStack_20 = in_XMM0_Qb;
    dVar5 = ON_3dVector::LengthSquared(&local_58);
    if (2.220446049250313e-16 < ABS(dVar5 + -1.0)) {
      ON_3dVector::Unitize(&local_58);
    }
    dVar6 = local_58.x * local_58.x * local_40 + local_38;
    this->m_xform[0][0] = dVar6;
    dVar7 = local_58.x * local_58.y * local_40;
    dVar11 = dVar7 - local_28 * local_58.z;
    this->m_xform[0][1] = dVar11;
    dVar5 = local_58.x * local_58.z * local_40;
    dVar10 = dVar5 + local_28 * local_58.y;
    this->m_xform[0][2] = dVar10;
    dVar7 = local_28 * local_58.z + dVar7;
    this->m_xform[1][0] = dVar7;
    dVar8 = local_58.y * local_58.y * local_40 + local_38;
    this->m_xform[1][1] = dVar8;
    dVar12 = local_58.y * local_58.z * local_40;
    dVar9 = dVar12 - local_28 * local_58.x;
    this->m_xform[1][2] = dVar9;
    dVar5 = dVar5 - local_28 * local_58.y;
    this->m_xform[2][0] = dVar5;
    dVar12 = local_28 * local_58.x + dVar12;
    this->m_xform[2][1] = dVar12;
    local_38 = local_58.z * local_58.z * local_40 + local_38;
    this->m_xform[2][2] = local_38;
    if ((((center.x != 0.0) || (NAN(center.x))) ||
        ((center.y != 0.0 || ((NAN(center.y) || (center.z != 0.0)))))) || (NAN(center.z))) {
      this->m_xform[0][3] = -(dVar10 * center.z + (dVar6 + -1.0) * center.x + dVar11 * center.y);
      this->m_xform[1][3] = -(dVar9 * center.z + dVar7 * center.x + (dVar8 + -1.0) * center.y);
      this->m_xform[2][3] = -((local_38 + -1.0) * center.z + dVar5 * center.x + dVar12 * center.y);
    }
    this->m_xform[3][0] = 0.0;
    this->m_xform[3][1] = 0.0;
    this->m_xform[3][2] = 0.0;
    this->m_xform[3][3] = 1.0;
  }
  return;
}

Assistant:

void ON_Xform::Rotation(  
        double sin_angle,
        double cos_angle,
        ON_3dVector axis,
        ON_3dPoint center
        )
{
  *this = ON_Xform::IdentityTransformation;

  for(;;)
  {
    // 29 June 2005 Dale Lear
    //     Kill noise in input
    if ( fabs(sin_angle) >= 1.0-ON_SQRT_EPSILON && fabs(cos_angle) <= ON_SQRT_EPSILON )
    {
      cos_angle = 0.0;
      sin_angle = (sin_angle < 0.0) ? -1.0 : 1.0; 
      break;
    }
    
    if ( fabs(cos_angle) >= 1.0-ON_SQRT_EPSILON && fabs(sin_angle) <= ON_SQRT_EPSILON )
    {
      cos_angle = (cos_angle < 0.0) ? -1.0 : 1.0; 
      sin_angle = 0.0;
      break;
    }
    
    if ( fabs(cos_angle*cos_angle + sin_angle*sin_angle - 1.0) > ON_SQRT_EPSILON )
    {
      ON_2dVector cs(cos_angle,sin_angle);
      if ( cs.Unitize() )
      {
        cos_angle = cs.x;
        sin_angle = cs.y;
        // no break here
      }
      else
      {
        ON_ERROR("sin_angle and cos_angle are both zero.");
        cos_angle = 1.0;
        sin_angle = 0.0;
        break;
      }
    }

    if ( fabs(cos_angle) > 1.0-ON_EPSILON || fabs(sin_angle) < ON_EPSILON )
    {
      cos_angle = (cos_angle < 0.0) ? -1.0 : 1.0; 
      sin_angle = 0.0;
      break;
    }

    if ( fabs(sin_angle) > 1.0-ON_EPSILON || fabs(cos_angle) < ON_EPSILON )
    {
      cos_angle = 0.0;
      sin_angle = (sin_angle < 0.0) ? -1.0 : 1.0; 
      break;
    }

    break;
  }

  if (sin_angle != 0.0 || cos_angle != 1.0) 
  {
    const double one_minus_cos_angle = 1.0 - cos_angle;
    ON_3dVector a = axis;
    if ( fabs(a.LengthSquared() - 1.0) >  ON_EPSILON )
      a.Unitize();

    m_xform[0][0] = a.x*a.x*one_minus_cos_angle + cos_angle;
    m_xform[0][1] = a.x*a.y*one_minus_cos_angle - a.z*sin_angle;
    m_xform[0][2] = a.x*a.z*one_minus_cos_angle + a.y*sin_angle;

    m_xform[1][0] = a.y*a.x*one_minus_cos_angle + a.z*sin_angle;
    m_xform[1][1] = a.y*a.y*one_minus_cos_angle + cos_angle;
    m_xform[1][2] = a.y*a.z*one_minus_cos_angle - a.x*sin_angle;

    m_xform[2][0] = a.z*a.x*one_minus_cos_angle - a.y*sin_angle;
    m_xform[2][1] = a.z*a.y*one_minus_cos_angle + a.x*sin_angle;
    m_xform[2][2] = a.z*a.z*one_minus_cos_angle + cos_angle;

    if ( center.x != 0.0 || center.y != 0.0 || center.z != 0.0 ) {
      m_xform[0][3] = -((m_xform[0][0]-1.0)*center.x + m_xform[0][1]*center.y + m_xform[0][2]*center.z);
      m_xform[1][3] = -(m_xform[1][0]*center.x + (m_xform[1][1]-1.0)*center.y + m_xform[1][2]*center.z);
      m_xform[2][3] = -(m_xform[2][0]*center.x + m_xform[2][1]*center.y + (m_xform[2][2]-1.0)*center.z);
    }

    m_xform[3][0] = m_xform[3][1] = m_xform[3][2] = 0.0;
    m_xform[3][3] = 1.0;
  }
}